

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void rw::flipDXT3(uint8 *dst,uint8 *src,uint32 width,uint32 height)

{
  uint uVar1;
  ulong uVar2;
  uint8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8 *puVar7;
  uint8 *dst_00;
  bool bVar8;
  
  uVar6 = width + 3 >> 2;
  if (height < 4) {
    if (height != 2) {
      memcpy(dst,src,(ulong)(uVar6 << 4));
      return;
    }
    puVar3 = src + 8;
    while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
      *dst = puVar3[-6];
      dst[1] = puVar3[-5];
      dst[2] = puVar3[-8];
      dst[3] = puVar3[-7];
      dst[4] = puVar3[-4];
      dst[5] = puVar3[-3];
      dst[6] = puVar3[-2];
      dst[7] = puVar3[-1];
      flipBlock_half(dst + 8,puVar3);
      puVar3 = puVar3 + 0x10;
      dst = dst + 0x10;
    }
  }
  else {
    uVar1 = height + 3 >> 2;
    uVar2 = (ulong)(uVar6 * 0x10);
    puVar3 = dst + (uVar6 * 0x10 * uVar1 - uVar2) + 8;
    for (uVar5 = 0; puVar7 = src, dst_00 = puVar3, uVar4 = uVar6, uVar5 != uVar1; uVar5 = uVar5 + 1)
    {
      while (uVar4 != 0) {
        dst_00[-2] = *puVar7;
        dst_00[-1] = puVar7[1];
        dst_00[-4] = puVar7[2];
        dst_00[-3] = puVar7[3];
        dst_00[-6] = puVar7[4];
        dst_00[-5] = puVar7[5];
        dst_00[-8] = puVar7[6];
        dst_00[-7] = puVar7[7];
        flipBlock(dst_00,puVar7 + 8);
        puVar7 = puVar7 + 0x10;
        dst_00 = dst_00 + 0x10;
        uVar4 = uVar4 - 1;
      }
      src = src + uVar2;
      puVar3 = puVar3 + -uVar2;
    }
  }
  return;
}

Assistant:

void
flipDXT3(uint8 *dst, uint8 *src, uint32 width, uint32 height)
{
	int x, y;
	int bw = (width+3)/4;
	int bh = (height+3)/4;
	if(height < 4){
		// used pixels are always at the top
		// so don't swap the full 4 rows
		if(height == 2){
			uint8 *s = src;
			uint8 *d = dst;
			for(x = 0; x < bw; x++){
				flipAlphaBlock3_half(d, s);
				flipBlock_half(d+8, s+8);
				s += 16;
				d += 16;
			}
		}else
			memcpy(dst, src, 16*bw);
		return;
	}
	dst += 16*bw*bh;
	for(y = 0; y < bh; y++){
		dst -= 16*bw;
		uint8 *s = src;
		uint8 *d = dst;
		for(x = 0; x < bw; x++){
			flipAlphaBlock3(d, s);
			flipBlock(d+8, s+8);
			s += 16;
			d += 16;
		}
		src += 16*bw;
	}
}